

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_rust_punycode.cc
# Opt level: O0

Nullable<char_*>
absl::lts_20250127::debugging_internal::DecodeRustPunycode(DecodeRustPunycodeOptions options)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  char *in_stack_00000008;
  uint32_t n_index;
  Utf8ForCodePoint utf8_for_code_point;
  uint32_t delta;
  uint32_t old_i;
  BoundedUtf8LengthSequence<256U> utf8_lengths;
  uint32_t local_48;
  uint32_t total_utf8_bytes;
  uint32_t num_chars;
  uint32_t bias;
  uint32_t i;
  uint32_t n;
  size_t out_size;
  char *out_end;
  char *out_begin;
  char *punycode_end;
  char *punycode_begin;
  
  punycode_end = in_stack_00000008;
  out_begin = options.punycode_begin;
  out_end = options.punycode_end;
  out_size = (size_t)options.out_begin;
  _i = (long)options.out_begin - (long)options.punycode_end;
  if (_i == 0) {
    punycode_begin = (char *)0x0;
  }
  else {
    *options.punycode_end = '\0';
    bias = 0x80;
    num_chars = 0;
    total_utf8_bytes = 0x48;
    local_48 = 0;
    bVar1 = anon_unknown_0::ConsumeOptionalAsciiPrefix
                      (&punycode_end,options.punycode_begin,options.punycode_end,options.out_begin,
                       &local_48);
    if (bVar1) {
      utf8_lengths.rep_[7]._4_4_ = local_48;
      BoundedUtf8LengthSequence<256U>::BoundedUtf8LengthSequence
                ((BoundedUtf8LengthSequence<256U> *)&delta);
      while (punycode_end != out_begin) {
        if (0xff < local_48) {
          return (Nullable<char_*>)0x0;
        }
        utf8_for_code_point.length = num_chars;
        bVar1 = anon_unknown_0::ScanNextDelta(&punycode_end,out_begin,total_utf8_bytes,&num_chars);
        if (!bVar1) {
          return (Nullable<char_*>)0x0;
        }
        uVar2 = 2;
        if (utf8_for_code_point.length == 0) {
          uVar2 = 700;
        }
        uVar2 = (num_chars - utf8_for_code_point.length) / uVar2;
        total_utf8_bytes = 0;
        for (utf8_for_code_point.bytes = (char  [4])(uVar2 / (local_48 + 1) + uVar2);
            0x1c7 < (uint)utf8_for_code_point.bytes;
            utf8_for_code_point.bytes = (char  [4])((uint)utf8_for_code_point.bytes / 0x23)) {
          total_utf8_bytes = total_utf8_bytes + 0x24;
        }
        total_utf8_bytes =
             (uint)((int)utf8_for_code_point.bytes * 0x24) /
             ((int)utf8_for_code_point.bytes + 0x26U) + total_utf8_bytes;
        bias = num_chars / (local_48 + 1) + bias;
        num_chars = num_chars % (local_48 + 1);
        Utf8ForCodePoint::Utf8ForCodePoint((Utf8ForCodePoint *)&stack0xffffffffffffff60,(ulong)bias)
        ;
        bVar1 = Utf8ForCodePoint::ok((Utf8ForCodePoint *)&stack0xffffffffffffff60);
        if (!bVar1) {
          return (Nullable<char_*>)0x0;
        }
        if (_i < utf8_lengths.rep_[7]._4_4_ + n_index + 1) {
          return (Nullable<char_*>)0x0;
        }
        uVar3 = BoundedUtf8LengthSequence<256U>::InsertAndReturnSumOfPredecessors
                          ((BoundedUtf8LengthSequence<256U> *)&delta,num_chars,n_index);
        memmove(out_end + (ulong)n_index + (ulong)uVar3,out_end + uVar3,
                (ulong)((utf8_lengths.rep_[7]._4_4_ + 1) - uVar3));
        memcpy(out_end + uVar3,&stack0xffffffffffffff60,(ulong)n_index);
        utf8_lengths.rep_[7]._4_4_ = n_index + utf8_lengths.rep_[7]._4_4_;
        local_48 = local_48 + 1;
        num_chars = num_chars + 1;
      }
      punycode_begin = out_end + utf8_lengths.rep_[7]._4_4_;
    }
    else {
      punycode_begin = (char *)0x0;
    }
  }
  return punycode_begin;
}

Assistant:

absl::Nullable<char*> DecodeRustPunycode(DecodeRustPunycodeOptions options) {
  const char* punycode_begin = options.punycode_begin;
  const char* const punycode_end = options.punycode_end;
  char* const out_begin = options.out_begin;
  char* const out_end = options.out_end;

  // Write a NUL terminator first.  Later memcpy calls will keep bumping it
  // along to its new right place.
  const size_t out_size = static_cast<size_t>(out_end - out_begin);
  if (out_size == 0) return nullptr;
  *out_begin = '\0';

  // RFC 3492 section 6.2 begins here.  We retain the names of integer variables
  // appearing in that text.
  uint32_t n = 128, i = 0, bias = 72, num_chars = 0;

  // If there are any ASCII characters, consume them and their trailing
  // underscore delimiter.
  if (!ConsumeOptionalAsciiPrefix(punycode_begin, punycode_end,
                                  out_begin, out_end, num_chars)) {
    return nullptr;
  }
  uint32_t total_utf8_bytes = num_chars;

  BoundedUtf8LengthSequence<kMaxChars> utf8_lengths;

  // "while the input is not exhausted do begin ... end"
  while (punycode_begin != punycode_end) {
    if (num_chars >= kMaxChars) return nullptr;

    const uint32_t old_i = i;

    if (!ScanNextDelta(punycode_begin, punycode_end, bias, i)) return nullptr;

    // Update bias as in RFC 3492 section 6.1.  (We have inlined adapt.)
    uint32_t delta = i - old_i;
    delta /= (old_i == 0 ? kDamp : 2);
    delta += delta/(num_chars + 1);
    bias = 0;
    while (delta > ((kBase - kTMin) * kTMax)/2) {
      delta /= kBase - kTMin;
      bias += kBase;
    }
    bias += ((kBase - kTMin + 1) * delta)/(delta + kSkew);

    // Back in section 6.2, compute the new code point and insertion index.
    static_assert(
        kMaxI + kMaxCodePoint < (uint64_t{1} << 32),
        "Make kMaxI smaller or n 64 bits wide to prevent silent wraparound");
    n += i/(num_chars + 1);
    i %= num_chars + 1;

    // To actually insert, we need to convert the code point n to UTF-8 and the
    // character index i to an index into the byte stream emitted so far.  First
    // prepare the UTF-8 encoding for n, rejecting surrogates, overlarge values,
    // and anything that won't fit into the remaining output storage.
    Utf8ForCodePoint utf8_for_code_point(n);
    if (!utf8_for_code_point.ok()) return nullptr;
    if (total_utf8_bytes + utf8_for_code_point.length + 1 > out_size) {
      return nullptr;
    }

    // Now insert the new character into both our length map and the output.
    uint32_t n_index =
        utf8_lengths.InsertAndReturnSumOfPredecessors(
            i, utf8_for_code_point.length);
    std::memmove(
        out_begin + n_index + utf8_for_code_point.length, out_begin + n_index,
        total_utf8_bytes + 1 - n_index);
    std::memcpy(out_begin + n_index, utf8_for_code_point.bytes,
                utf8_for_code_point.length);
    total_utf8_bytes += utf8_for_code_point.length;
    ++num_chars;

    // Finally, advance to the next state before continuing.
    ++i;
  }

  return out_begin + total_utf8_bytes;
}